

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O2

ostream * __thiscall tchecker::while_statement_t::output(while_statement_t *this,ostream *os)

{
  element_type *peVar1;
  element_type *peVar2;
  
  std::operator<<(os,"while ");
  peVar1 = (this->_condition).
           super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_expression_t[4])(peVar1,os);
  std::operator<<(os," do ");
  peVar2 = (this->_stmt).super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (*peVar2->_vptr_statement_t[4])(peVar2,os);
  std::operator<<(os," done");
  return os;
}

Assistant:

std::ostream & while_statement_t::output(std::ostream & os) const
{
  os << "while ";
  _condition->output(os);
  os << " do ";
  _stmt->output(os);
  os << " done";
  return os;
}